

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

FIOBJ fiobj_str_new(char *str,size_t len)

{
  undefined1 *puVar1;
  int *piVar2;
  fio_str_info_s local_30;
  
  puVar1 = (undefined1 *)fio_malloc(0x40);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x28;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    puVar1[0x10] = 1;
    *(undefined8 *)(puVar1 + 0x11) = 0;
    *(undefined8 *)(puVar1 + 0x19) = 0;
    *(undefined8 *)(puVar1 + 0x21) = 0;
    *(undefined8 *)(puVar1 + 0x29) = 0;
    *(undefined8 *)(puVar1 + 0x30) = 0;
    *(undefined8 *)(puVar1 + 0x38) = 0;
    if (len != 0 && str != (char *)0x0) {
      fio_str_write(&local_30,(fio_str_s_conflict *)(puVar1 + 0x10),str,len);
    }
    return (ulong)puVar1 | 2;
  }
  perror("ERROR: fiobj string couldn\'t allocate memory");
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

FIOBJ fiobj_str_new(const char *str, size_t len) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (str && len) {
    fio_str_write(&s->str, str, len);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}